

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O1

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  size_t sVar1;
  uint uVar2;
  format_int fStack_38;
  
  if (n < 1000) {
    uVar2 = n % 100;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(n / 100) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar2 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
  }
  else {
    fStack_38.str_ = fmt::v7::format_int::format_unsigned<unsigned_int>(&fStack_38,n);
    if ((long)&fStack_38 - (long)fStack_38.str_ < -0x15) {
      fmt::v7::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
                 ,0x146,"negative value");
    }
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,fStack_38.str_,
               fStack_38.str_ + ((long)&fStack_38 - (long)fStack_38.str_) + 0x15);
  }
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000)
    {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    }
    else
    {
        append_int(n, dest);
    }
}